

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<double>::Lodeangle(TPZTensor<double> *this,TPZTensor<double> *GradLode,double *Lode)

{
  double dVar1;
  double dVar2;
  ulong extraout_XMM0_Qb;
  double dVar3;
  ulong uVar4;
  double oneoverden;
  double local_1f0;
  double local_1e8;
  int local_1dc;
  double local_1d8;
  double local_1c8;
  ulong uStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_190;
  TPZTensor<double> dJ2t;
  TPZTensor<double> dJ3t;
  TPZTensor<double> TempTensor;
  TPZTensor<double> dLodeAngle;
  
  dVar1 = J2(this);
  local_1d8 = J3(this);
  uVar4 = ~(extraout_XMM0_Qb & 0x7fffffffffffffff) & extraout_XMM0_Qb;
  dVar1 = (double)(~-(ulong)(ABS(dVar1) < 1e-06) & (ulong)dVar1 |
                  -(ulong)(ABS(dVar1) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  if (dVar1 < 0.0) {
    sqrt(dVar1);
  }
  TPZTensor(&dJ2t);
  TPZTensor(&dJ3t);
  dJ2(this,&dJ2t);
  dJ3(this,&dJ3t);
  TPZTensor(&dLodeAngle);
  TPZTensor(&TempTensor);
  local_1c8 = dVar1 + dVar1;
  local_1a8 = local_1d8 * 9.0 * local_1d8;
  local_1b8 = dVar1 * dVar1 * dVar1;
  uStack_1c0 = uVar4;
  dStack_1b0 = local_1b8;
  dStack_1a0 = local_1b8;
  if (local_1b8 < 0.0) {
    local_1f0 = local_1d8 * 3.0;
    dVar2 = sqrt(local_1b8);
    local_190 = local_1f0;
  }
  else {
    dVar2 = SQRT(local_1b8);
    local_190 = local_1d8 * 3.0;
  }
  local_1e8 = (double)CONCAT44(local_1e8._4_4_,1);
  Multiply<double,int>(&dJ2t,&local_190,(int *)&local_1e8);
  local_1e8 = local_1c8;
  oneoverden = (double)CONCAT44(oneoverden._4_4_,1);
  Multiply<double,int>(&dJ3t,&local_1e8,(int *)&oneoverden);
  oneoverden = (double)CONCAT44(oneoverden._4_4_,0xffffffff);
  Add<double,int>(&dJ2t,&dJ3t,(int *)&oneoverden);
  dVar3 = local_1a8 / local_1b8;
  dVar1 = dVar1 * local_1b8 * dVar1;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar3 = 1.3333333333333333 -
          (double)(~-(ulong)(dVar3 < 1.3333333333333333) & (ulong)(dVar3 * 0.999) |
                  (ulong)dVar3 & -(ulong)(dVar3 < 1.3333333333333333));
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  oneoverden = 1.0 / ((dVar1 + dVar1) * dVar3);
  local_1dc = 1;
  Multiply<double,int>(&dJ2t,&oneoverden,&local_1dc);
  operator*=(&dJ2t,&oneoverden);
  dVar1 = (local_1d8 * 5.196152422706632) / (dVar2 + dVar2);
  dVar1 = (double)(~-(ulong)(-1.0 < dVar1) & (ulong)(dVar1 * 0.999) |
                  (ulong)dVar1 & -(ulong)(-1.0 < dVar1));
  dVar1 = acos((double)(~-(ulong)(dVar1 < 1.0) & (ulong)(dVar1 * 0.999) |
                       -(ulong)(dVar1 < 1.0) & (ulong)dVar1));
  dVar1 = dVar1 / 3.0;
  *Lode = (double)(~-(ulong)(dVar1 < 1.0470975511965976) & (ulong)(dVar1 * 0.999) |
                  (ulong)dVar1 & -(ulong)(dVar1 < 1.0470975511965976));
  ~TPZTensor(&TempTensor);
  ~TPZTensor(&dLodeAngle);
  ~TPZTensor(&dJ3t);
  ~TPZTensor(&dJ2t);
  return;
}

Assistant:

void TPZTensor<T>::Lodeangle(TPZTensor<T> &GradLode, T &Lode)const {
    T J2t(this->J2());
    T J3t(this->J3());

    if (fabs(TPZExtractVal::val(J2t)) < 1.e-6)J2t = T(1.e-6);
    T sqrtJ2t = sqrt(J2t);
    if (fabs(TPZExtractVal::val(sqrtJ2t)) < 1.e-6)sqrtJ2t = T(1.e-6);

    TPZTensor<T> dJ2t, dJ3t;

    this->dJ2(dJ2t);
    this->dJ3(dJ3t);
    // Derivatives with respect to I1, J2 and J3

    TPZTensor<T> dLodeAngle, TempTensor;

    //QUAL DOS DOIS?
    //T theta =-asin( ( T( 3.) * sqrt( T( 3.) ) * J3t ) /( T( 2.) *  sqrt(J2t*J2t*J2t) ) )/T( 3.);
    //O GRADIENTE DO LODE ESTA EM FUNCAO DO LODE DE 0 a Pi/3


    T lodetemp = (T(3.) * sqrt(T(3.)) * J3t) / (T(2.) * sqrt(J2t * J2t * J2t));
    if (TPZExtractVal::val(lodetemp) <= -1.) {
        lodetemp *= T(0.999); //	DebugStop();
        // TPZExtractVal::val(lodetemp) *= T(0.999);	//	DebugStop();
        //lodetemp = T(-1.);

    }


    //cout << "\n lodetemp "<<lodetemp<<endl;
    //cout << "\n TPZExtractVal::val(lodetemp);"<<TPZExtractVal::val(lodetemp)<<endl;

    if (TPZExtractVal::val(lodetemp) >= 1.) {
        lodetemp *= T(0.999);
        // TPZExtractVal::val(lodetemp)*= 0.999;
        // lodetemp = T(1.);
        //DebugStop();
    }

    //DLODE = (-2*Dj3*j2 + 3*Dj2*J3t)/(2.*pow(J2t,2.5)*sqrt(1.3333333333333333 - (9*pow(J3t,2))/pow(J2t,3)))
    //1
    T j33 = T(3.) * J3t;
    dJ2t.Multiply(j33, 1);
    //2
    T j22 = T(2.) * J2t;
    dJ3t.Multiply(j22, 1);
    //3
    dJ2t.Add(dJ3t, -1);
    //4
    //if(TPZExtractVal::val(J2t)<1.e-6)J2t=1.e-6;
    T checknegativeroot = ((T(9.) * J3t * J3t) / (J2t * J2t * J2t));
    if (TPZExtractVal::val(checknegativeroot) >= 4 / 3.)checknegativeroot *= T(0.999);
    T denom = T(2.) * sqrt(J2t * J2t * J2t * J2t * J2t) * sqrt((T(4 / 3.)) - checknegativeroot);
    //T denom2 = (T(2.)*pow(J2t,2.5)*sqrt(T(1.3333333333333333) - (T(9.)*pow(J3t,2.))/pow(J2t,3)));
    T oneoverden = T(1.) / denom;
    dJ2t.Multiply(oneoverden, 1);
    dJ2t *= oneoverden;
    //    GradLode = dJ2t;

    T acoslodetemp = acos(lodetemp);
    Lode = acoslodetemp / T(3.);

    if (TPZExtractVal::val(Lode) >= (M_PI / 3.) - 0.0001) {
        Lode *= T(0.999);
    }
}